

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O2

int mp_exptmod_fast(mp_int *G,mp_int *X,mp_int *P,mp_int *Y,int redmode)

{
  mp_digit *pmVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  mp_digit mVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  mp_int *pmVar11;
  mp_int *b;
  mp_digit mVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  int local_18d0;
  uint local_18cc;
  code *local_18c8;
  int local_18b4;
  mp_int res;
  mp_digit mp;
  int local_186c;
  mp_int *local_1868;
  mp_int *local_1860;
  mp_int t;
  mp_int M [256];
  
  uVar5 = mp_count_bits(X);
  if ((int)uVar5 < 8) {
    iVar8 = 2;
  }
  else if (uVar5 < 0x25) {
    iVar8 = 3;
  }
  else if (uVar5 < 0x8d) {
    iVar8 = 4;
  }
  else if (uVar5 < 0x1c3) {
    iVar8 = 5;
  }
  else if (uVar5 < 0x518) {
    iVar8 = 6;
  }
  else {
    iVar8 = 8 - (uint)(uVar5 < 0xdca);
  }
  iVar6 = mp_init(M + 1);
  if (iVar6 != 0) {
    return iVar6;
  }
  iVar6 = iVar8 + -1;
  uVar17 = (ulong)(uint)(1 << ((byte)iVar6 & 0x1f));
  uVar5 = 1 << ((byte)iVar8 & 0x1f);
  uVar15 = (ulong)uVar5;
  pmVar11 = M + uVar17;
  local_1868 = X;
  local_1860 = Y;
  for (uVar16 = uVar17; uVar16 < uVar15; uVar16 = uVar16 + 1) {
    iVar7 = mp_init(pmVar11);
    if (iVar7 != 0) {
      pmVar11 = M + uVar17;
      for (; uVar17 < uVar16; uVar17 = uVar17 + 1) {
        mp_clear(pmVar11);
        pmVar11 = pmVar11 + 1;
      }
      mp_clear(M + 1);
      return iVar7;
    }
    pmVar11 = pmVar11 + 1;
  }
  if (redmode == 0) {
    iVar7 = mp_montgomery_setup(P,&mp);
    if (iVar7 != 0) goto LAB_00107101;
    local_18c8 = mp_montgomery_reduce;
    if (P->used < 0x100) {
      local_18c8 = fast_mp_montgomery_reduce;
    }
  }
  else if (redmode == 1) {
    mp = 0x1000000000000000 - *P->dp;
    local_18c8 = mp_dr_reduce;
  }
  else {
    iVar7 = mp_reduce_2k_setup(P,&mp);
    if (iVar7 != 0) goto LAB_00107101;
    local_18c8 = mp_reduce_2k;
  }
  pmVar11 = M + 1;
  iVar7 = mp_init(&res);
  if (iVar7 != 0) goto LAB_00107101;
  if (redmode == 0) {
    iVar7 = mp_montgomery_calc_normalization(&res,P);
    if (iVar7 != 0) goto LAB_001070ef;
    iVar7 = mp_mulmod(G,&res,P,pmVar11);
  }
  else {
    mp_set(&res,1);
    iVar7 = mp_mod(G,P,pmVar11);
  }
  if (iVar7 == 0) {
    b = M + uVar17;
    iVar7 = mp_copy(pmVar11,b);
    mVar4 = mp;
    if (iVar7 == 0) {
      iVar13 = 0;
      if (0 < iVar6) {
        iVar13 = iVar6;
      }
      iVar13 = iVar13 + 1;
      do {
        iVar13 = iVar13 + -1;
        uVar16 = uVar17;
        if (iVar13 == 0) goto LAB_0010714e;
        iVar7 = mp_sqr(b,b);
      } while ((iVar7 == 0) && (iVar7 = (*local_18c8)(b,P,mVar4), iVar7 == 0));
    }
  }
  goto LAB_001070ef;
  while( true ) {
    b = b + 1;
    iVar7 = (*local_18c8)(pmVar11,P,mVar4);
    uVar16 = uVar16 + 1;
    if (iVar7 != 0) break;
LAB_0010714e:
    if (uVar15 <= uVar16 + 1) {
      local_18b4 = local_1868->used + -1;
      local_186c = iVar8 + 1;
      mVar12 = 0;
      local_18cc = 0;
      local_18d0 = 0;
      iVar6 = 1;
      iVar13 = 0;
      goto LAB_001071c6;
    }
    pmVar11 = b + 1;
    iVar7 = mp_mul(b,M + 1,pmVar11);
    if (iVar7 != 0) break;
  }
  goto LAB_001070ef;
  while (iVar13 = 1, iVar7 == 0) {
LAB_001071c6:
    do {
      iVar7 = iVar13;
      iVar6 = iVar6 + -1;
      if (iVar6 == 0) {
        if (local_18b4 == -1) {
          if (local_18d0 < 1 || iVar7 != 2) goto LAB_00107399;
          goto LAB_00107319;
        }
        lVar10 = (long)local_18b4;
        local_18b4 = local_18b4 + -1;
        mVar12 = local_1868->dp[lVar10];
        iVar6 = 0x3c;
      }
      uVar9 = (uint)(mVar12 >> 0x3b) & 1;
      mVar12 = mVar12 * 2;
      iVar13 = 0;
    } while (iVar7 == 0 && uVar9 == 0);
    if ((iVar7 == 1) && (uVar9 == 0)) {
      iVar7 = mp_sqr(&res,&res);
      if (iVar7 != 0) break;
      iVar7 = (*local_18c8)(&res,P,mVar4);
    }
    else {
      local_18d0 = local_18d0 + 1;
      local_18cc = local_18cc | uVar9 << ((byte)iVar8 - (char)local_18d0 & 0x1f);
      iVar14 = local_186c;
      iVar13 = 2;
      if (iVar8 != local_18d0) goto LAB_001071c6;
      while (iVar14 + -1 != 0) {
        iVar7 = mp_sqr(&res,&res);
        if ((iVar7 != 0) || (iVar7 = (*local_18c8)(&res,P,mVar4), iVar14 = iVar14 + -1, iVar7 != 0))
        goto LAB_001070ef;
      }
      iVar7 = mp_mul(&res,M + (int)local_18cc,&res);
      if (iVar7 != 0) break;
      iVar7 = (*local_18c8)(&res,P,mVar4);
      local_18cc = 0;
      local_18d0 = 0;
    }
  }
  goto LAB_001070ef;
LAB_00107399:
  if ((redmode != 0) || (iVar7 = (*local_18c8)(&res,P,mVar4), iVar7 == 0)) {
    pmVar1 = local_1860->dp;
    uVar2._0_4_ = local_1860->used;
    uVar2._4_4_ = local_1860->alloc;
    uVar3._0_4_ = local_1860->sign;
    uVar3._4_4_ = *(undefined4 *)&local_1860->field_0xc;
    local_1860->used = res.used;
    local_1860->alloc = res.alloc;
    local_1860->sign = res.sign;
    *(undefined4 *)&local_1860->field_0xc = res._12_4_;
    local_1860->dp = res.dp;
    iVar7 = 0;
    res._0_8_ = uVar2;
    res._8_8_ = uVar3;
    res.dp = pmVar1;
  }
  goto LAB_001070ef;
  while (((iVar7 = mp_sqr(&res,&res), iVar7 == 0 &&
          (iVar7 = (*local_18c8)(&res,P,mVar4), iVar7 == 0)) &&
         ((local_18cc = local_18cc * 2, (local_18cc & uVar5) == 0 ||
          ((iVar7 = mp_mul(&res,M + 1,&res), iVar7 == 0 &&
           (iVar7 = (*local_18c8)(&res,P,mVar4), iVar7 == 0))))))) {
LAB_00107319:
    bVar18 = local_18d0 == 0;
    local_18d0 = local_18d0 + -1;
    if (bVar18) goto LAB_00107399;
  }
LAB_001070ef:
  mp_clear(&res);
LAB_00107101:
  mp_clear(M + 1);
  pmVar11 = M + uVar17;
  for (; uVar17 < uVar15; uVar17 = uVar17 + 1) {
    mp_clear(pmVar11);
    pmVar11 = pmVar11 + 1;
  }
  return iVar7;
}

Assistant:

int mp_exptmod_fast (mp_int * G, mp_int * X, mp_int * P, mp_int * Y, int redmode)
{
  mp_int  M[TAB_SIZE], res;
  mp_digit buf, mp;
  int     err, bitbuf, bitcpy, bitcnt, mode, digidx, x, y, winsize;

  /* use a pointer to the reduction algorithm.  This allows us to use
   * one of many reduction algorithms without modding the guts of
   * the code with if statements everywhere.
   */
  int     (*redux)(mp_int*,mp_int*,mp_digit);

  /* find window size */
  x = mp_count_bits (X);
  if (x <= 7) {
    winsize = 2;
  } else if (x <= 36) {
    winsize = 3;
  } else if (x <= 140) {
    winsize = 4;
  } else if (x <= 450) {
    winsize = 5;
  } else if (x <= 1303) {
    winsize = 6;
  } else if (x <= 3529) {
    winsize = 7;
  } else {
    winsize = 8;
  }

  /* init M array */
  /* init first cell */
  if ((err = mp_init(&M[1])) != MP_OKAY) {
     return err;
  }

  /* now init the second half of the array */
  for (x = 1<<(winsize-1); x < (1 << winsize); x++) {
    if ((err = mp_init(&M[x])) != MP_OKAY) {
      for (y = 1<<(winsize-1); y < x; y++) {
        mp_clear (&M[y]);
      }
      mp_clear(&M[1]);
      return err;
    }
  }

  /* determine and setup reduction code */
  if (redmode == 0) {
     /* now setup montgomery  */
     if ((err = mp_montgomery_setup (P, &mp)) != MP_OKAY) {
        goto LBL_M;
     }

     /* automatically pick the comba one if available (saves quite a few calls/ifs) */
     if (((P->used * 2 + 1) < MP_WARRAY) &&
          P->used < (1 << ((CHAR_BIT * sizeof (mp_word)) - (2 * DIGIT_BIT)))) {
        redux = fast_mp_montgomery_reduce;
     } else 
     {
        /* use slower baseline Montgomery method */
        redux = mp_montgomery_reduce;
     }
  } else if (redmode == 1) {
     /* setup DR reduction for moduli of the form B**k - b */
     mp_dr_setup(P, &mp);
     redux = mp_dr_reduce;
  } else {
     /* setup DR reduction for moduli of the form 2**k - b */
     if ((err = mp_reduce_2k_setup(P, &mp)) != MP_OKAY) {
        goto LBL_M;
     }
     redux = mp_reduce_2k;
  }

  /* setup result */
  if ((err = mp_init (&res)) != MP_OKAY) {
    goto LBL_M;
  }

  /* create M table
   *

   *
   * The first half of the table is not computed though accept for M[0] and M[1]
   */

  if (redmode == 0) {
     /* now we need R mod m */
     if ((err = mp_montgomery_calc_normalization (&res, P)) != MP_OKAY) {
       goto LBL_RES;
     }

     /* now set M[1] to G * R mod m */
     if ((err = mp_mulmod (G, &res, P, &M[1])) != MP_OKAY) {
       goto LBL_RES;
     }
  } else {
     mp_set(&res, 1);
     if ((err = mp_mod(G, P, &M[1])) != MP_OKAY) {
        goto LBL_RES;
     }
  }

  /* compute the value at M[1<<(winsize-1)] by squaring M[1] (winsize-1) times */
  if ((err = mp_copy (&M[1], &M[1 << (winsize - 1)])) != MP_OKAY) {
    goto LBL_RES;
  }

  for (x = 0; x < (winsize - 1); x++) {
    if ((err = mp_sqr (&M[1 << (winsize - 1)], &M[1 << (winsize - 1)])) != MP_OKAY) {
      goto LBL_RES;
    }
    if ((err = redux (&M[1 << (winsize - 1)], P, mp)) != MP_OKAY) {
      goto LBL_RES;
    }
  }

  /* create upper table */
  for (x = (1 << (winsize - 1)) + 1; x < (1 << winsize); x++) {
    if ((err = mp_mul (&M[x - 1], &M[1], &M[x])) != MP_OKAY) {
      goto LBL_RES;
    }
    if ((err = redux (&M[x], P, mp)) != MP_OKAY) {
      goto LBL_RES;
    }
  }

  /* set initial mode and bit cnt */
  mode   = 0;
  bitcnt = 1;
  buf    = 0;
  digidx = X->used - 1;
  bitcpy = 0;
  bitbuf = 0;

  for (;;) {
    /* grab next digit as required */
    if (--bitcnt == 0) {
      /* if digidx == -1 we are out of digits so break */
      if (digidx == -1) {
        break;
      }
      /* read next digit and reset bitcnt */
      buf    = X->dp[digidx--];
      bitcnt = (int)DIGIT_BIT;
    }

    /* grab the next msb from the exponent */
    y     = (mp_digit)(buf >> (DIGIT_BIT - 1)) & 1;
    buf <<= (mp_digit)1;

    /* if the bit is zero and mode == 0 then we ignore it
     * These represent the leading zero bits before the first 1 bit
     * in the exponent.  Technically this opt is not required but it
     * does lower the # of trivial squaring/reductions used
     */
    if (mode == 0 && y == 0) {
      continue;
    }

    /* if the bit is zero and mode == 1 then we square */
    if (mode == 1 && y == 0) {
      if ((err = mp_sqr (&res, &res)) != MP_OKAY) {
        goto LBL_RES;
      }
      if ((err = redux (&res, P, mp)) != MP_OKAY) {
        goto LBL_RES;
      }
      continue;
    }

    /* else we add it to the window */
    bitbuf |= (y << (winsize - ++bitcpy));
    mode    = 2;

    if (bitcpy == winsize) {
      /* ok window is filled so square as required and multiply  */
      /* square first */
      for (x = 0; x < winsize; x++) {
        if ((err = mp_sqr (&res, &res)) != MP_OKAY) {
          goto LBL_RES;
        }
        if ((err = redux (&res, P, mp)) != MP_OKAY) {
          goto LBL_RES;
        }
      }

      /* then multiply */
      if ((err = mp_mul (&res, &M[bitbuf], &res)) != MP_OKAY) {
        goto LBL_RES;
      }
      if ((err = redux (&res, P, mp)) != MP_OKAY) {
        goto LBL_RES;
      }

      /* empty window and reset */
      bitcpy = 0;
      bitbuf = 0;
      mode   = 1;
    }
  }

  /* if bits remain then square/multiply */
  if (mode == 2 && bitcpy > 0) {
    /* square then multiply if the bit is set */
    for (x = 0; x < bitcpy; x++) {
      if ((err = mp_sqr (&res, &res)) != MP_OKAY) {
        goto LBL_RES;
      }
      if ((err = redux (&res, P, mp)) != MP_OKAY) {
        goto LBL_RES;
      }

      /* get next bit of the window */
      bitbuf <<= 1;
      if ((bitbuf & (1 << winsize)) != 0) {
        /* then multiply */
        if ((err = mp_mul (&res, &M[1], &res)) != MP_OKAY) {
          goto LBL_RES;
        }
        if ((err = redux (&res, P, mp)) != MP_OKAY) {
          goto LBL_RES;
        }
      }
    }
  }

  if (redmode == 0) {
     /* fixup result if Montgomery reduction is used
      * recall that any value in a Montgomery system is
      * actually multiplied by R mod n.  So we have
      * to reduce one more time to cancel out the factor
      * of R.
      */
     if ((err = redux(&res, P, mp)) != MP_OKAY) {
       goto LBL_RES;
     }
  }

  /* swap res with Y */
  mp_exch (&res, Y);
  err = MP_OKAY;
LBL_RES:mp_clear (&res);
LBL_M:
  mp_clear(&M[1]);
  for (x = 1<<(winsize-1); x < (1 << winsize); x++) {
    mp_clear (&M[x]);
  }
  return err;
}